

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPrs.h
# Opt level: O0

void Psr_ManVecFree(Vec_Ptr_t *vPrs)

{
  int iVar1;
  Psr_Ntk_t *p;
  undefined4 local_1c;
  int i;
  Psr_Ntk_t *pNtk;
  Vec_Ptr_t *vPrs_local;
  
  for (local_1c = 0; iVar1 = Vec_PtrSize(vPrs), local_1c < iVar1; local_1c = local_1c + 1) {
    p = (Psr_Ntk_t *)Vec_PtrEntry(vPrs,local_1c);
    Psr_NtkFree(p);
  }
  Vec_PtrFree(vPrs);
  return;
}

Assistant:

static inline void Psr_ManVecFree( Vec_Ptr_t * vPrs )
{
    Psr_Ntk_t * pNtk; int i;
    Vec_PtrForEachEntry( Psr_Ntk_t *, vPrs, pNtk, i )
        Psr_NtkFree( pNtk );
    Vec_PtrFree( vPrs );
}